

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_node_<false,true,false,double_const&>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *sib,Vertex_handle v,
          double *filtration_value)

{
  __node_base_ptr p_Var1;
  undefined4 in_register_00000014;
  ulong uVar2;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  *ret_val;
  pair<boost::container::vec_iterator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  pVar3;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  pVar4;
  uint local_3c;
  __node_base local_38;
  int local_30 [2];
  __buckets_ptr local_28;
  undefined1 local_20;
  
  local_38._M_nxt = (_Hash_node_base *)CONCAT44(in_register_00000014,v);
  local_3c = (uint)filtration_value;
  local_30[0] = 0;
  local_30[1] = 0;
  pVar3 = boost::container::dtl::
          flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
          ::
          try_emplace<int_const&,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>*&,double_const&>
                    ((flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
                      *)&local_28,(const_iterator *)(local_38._M_nxt + 2),local_30,
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                      **)&local_3c,(double *)&local_38);
  uVar2 = pVar3._8_8_;
  (this->nodes_label_to_list_)._M_h._M_buckets = local_28;
  *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_20;
  if (*(int *)&local_28[3][1]._M_nxt != *(int *)local_28) {
    p_Var1 = (__node_base_ptr)operator_new(0x28);
    uVar2 = (ulong)local_3c;
    p_Var1->_M_nxt = local_38._M_nxt;
    *(uint *)&p_Var1[1]._M_nxt = local_3c;
    p_Var1[2]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[3]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[4]._M_nxt = (_Hash_node_base *)0x0;
    local_28[3] = p_Var1;
  }
  pVar4._8_8_ = uVar2;
  pVar4.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)this;
  return pVar4;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }